

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::SocketRecvFailed::SocketRecvFailed(SocketRecvFailed *this,ssize_t size)

{
  allocator<char> local_39;
  string local_38;
  
  if (size == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Connection reset by peer.",&local_39);
  }
  else if (size < 0) {
    SocketException::errorToWhat_abi_cxx11_();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Success.",&local_39);
  }
  SocketException::SocketException(&this->super_SocketException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_SocketException).super_Exception = &PTR__Exception_001ef010;
  return;
}

Assistant:

SocketRecvFailed( ssize_t size )
    : SocketException( size == 0 ? "Connection reset by peer." : size < 0 ? errorToWhat() : "Success." ) {}